

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O2

size_t tinyusdz::Usd_IntegerCompression::CompressToBuffer
                 (int32_t *ints,size_t numInts,char *compressed,string *err)

{
  int iVar1;
  size_t sVar2;
  __uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true> _Var3;
  mapped_type *pmVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  ulong inputSize;
  int iVar9;
  ulong uVar10;
  byte bVar11;
  long lVar12;
  int iVar13;
  byte *pbVar14;
  long lVar15;
  bool bVar16;
  long lStack_a0;
  int local_8c;
  char *local_88;
  string *local_80;
  unique_ptr<char[],_std::default_delete<char[]>_> encodeBuffer;
  unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  counts;
  
  sVar2 = anon_unknown_0::_GetEncodedBufferSize<int>(numInts);
  _Var3.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)operator_new__(sVar2);
  inputSize = 0;
  encodeBuffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 _Var3.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
  if (numInts != 0) {
    counts._M_h._M_buckets = &counts._M_h._M_single_bucket;
    counts._M_h._M_bucket_count = 1;
    counts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    counts._M_h._M_element_count = 0;
    counts._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    counts._M_h._M_rehash_policy._M_next_resize = 0;
    counts._M_h._M_single_bucket = (__node_base_ptr)0x0;
    uVar10 = 0;
    iVar13 = 0;
    local_88 = compressed;
    local_80 = err;
    for (lVar12 = 0; numInts * 4 - lVar12 != 0; lVar12 = lVar12 + 4) {
      local_8c = *(int *)((long)ints + lVar12) - (int)inputSize;
      pmVar4 = ::std::__detail::
               _Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&counts,&local_8c);
      uVar7 = *pmVar4 + 1;
      *pmVar4 = uVar7;
      bVar16 = uVar7 == uVar10;
      iVar9 = local_8c;
      if (((uVar7 <= uVar10) && (uVar7 = uVar10, iVar9 = iVar13, bVar16)) && (iVar13 < local_8c)) {
        iVar9 = local_8c;
      }
      inputSize = (ulong)*(uint *)((long)ints + lVar12);
      uVar10 = uVar7;
      iVar13 = iVar9;
    }
    ::std::
    _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&counts._M_h);
    *(int *)_Var3.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
            super__Head_base<0UL,_char_*,_false>._M_head_impl = iVar13;
    pbVar14 = (byte *)((long)_Var3.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl + 4);
    piVar8 = (int *)((long)_Var3.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl +
                     (numInts * 2 + 7 >> 3) + 4);
    iVar9 = 0;
LAB_00269a8e:
    switch(numInts) {
    case 0:
LAB_00269c81:
      inputSize = (long)piVar8 -
                  (long)_Var3.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                        super__Head_base<0UL,_char_*,_false>._M_head_impl;
      err = local_80;
      compressed = local_88;
      break;
    case 1:
      iVar9 = *ints - iVar9;
      if (iVar9 == iVar13) {
        bVar11 = 0;
      }
      else if ((char)iVar9 == iVar9) {
        *(char *)piVar8 = (char)iVar9;
        piVar8 = (int *)((long)piVar8 + 1);
        bVar11 = 1;
      }
      else if ((short)iVar9 == iVar9) {
        *(short *)piVar8 = (short)iVar9;
        piVar8 = (int *)((long)piVar8 + 2);
        bVar11 = 2;
      }
      else {
        *piVar8 = iVar9;
        piVar8 = piVar8 + 1;
        bVar11 = 3;
      }
      goto LAB_00269c7e;
    case 2:
      iVar6 = *ints;
      iVar9 = iVar6 - iVar9;
      if (iVar9 == iVar13) {
        bVar11 = 0;
      }
      else if ((char)iVar9 == iVar9) {
        *(char *)piVar8 = (char)iVar9;
        piVar8 = (int *)((long)piVar8 + 1);
        bVar11 = 1;
      }
      else if ((short)iVar9 == iVar9) {
        *(short *)piVar8 = (short)iVar9;
        piVar8 = (int *)((long)piVar8 + 2);
        bVar11 = 2;
      }
      else {
        *piVar8 = iVar9;
        piVar8 = piVar8 + 1;
        bVar11 = 3;
      }
      iVar6 = ints[1] - iVar6;
      if (iVar6 != iVar13) {
        if ((char)iVar6 == iVar6) {
          *(char *)piVar8 = (char)iVar6;
          bVar5 = 4;
          lStack_a0 = 1;
        }
        else if ((short)iVar6 == iVar6) {
          *(short *)piVar8 = (short)iVar6;
          bVar5 = 8;
          lStack_a0 = 2;
        }
        else {
          *piVar8 = iVar6;
          bVar5 = 0xc;
          lStack_a0 = 4;
        }
        piVar8 = (int *)((long)piVar8 + lStack_a0);
        bVar11 = bVar11 | bVar5;
      }
      goto LAB_00269c7e;
    case 3:
      bVar11 = 0;
      for (lVar12 = 0; (int)lVar12 != 6; lVar12 = lVar12 + 2) {
        iVar6 = *(int *)((long)ints + lVar12 * 2);
        iVar9 = iVar6 - iVar9;
        if (iVar9 != iVar13) {
          bVar5 = (byte)lVar12;
          if ((char)iVar9 == iVar9) {
            bVar5 = (byte)(1 << (bVar5 & 0x1f));
            *(char *)piVar8 = (char)iVar9;
            lVar15 = 1;
          }
          else if ((short)iVar9 == iVar9) {
            bVar5 = (byte)(2 << (bVar5 & 0x1f));
            *(short *)piVar8 = (short)iVar9;
            lVar15 = 2;
          }
          else {
            bVar5 = (byte)(3 << (bVar5 & 0x1f));
            *piVar8 = iVar9;
            lVar15 = 4;
          }
          piVar8 = (int *)((long)piVar8 + lVar15);
          bVar11 = bVar11 | bVar5;
        }
        iVar9 = iVar6;
      }
LAB_00269c7e:
      *pbVar14 = bVar11;
      goto LAB_00269c81;
    default:
      goto switchD_00269b0d_default;
    }
  }
  sVar2 = LZ4Compression::CompressToBuffer
                    ((char *)encodeBuffer._M_t.
                             super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl,compressed,inputSize,
                     err);
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&encodeBuffer);
  return sVar2;
switchD_00269b0d_default:
  bVar11 = 0;
  for (iVar6 = 0; iVar6 != 8; iVar6 = iVar6 + 2) {
    iVar1 = *ints;
    iVar9 = iVar1 - iVar9;
    if (iVar9 != iVar13) {
      bVar5 = (byte)iVar6;
      if ((char)iVar9 == iVar9) {
        bVar5 = (byte)(1 << (bVar5 & 0x1f));
        *(char *)piVar8 = (char)iVar9;
        lVar12 = 1;
      }
      else if ((short)iVar9 == iVar9) {
        bVar5 = (byte)(2 << (bVar5 & 0x1f));
        *(short *)piVar8 = (short)iVar9;
        lVar12 = 2;
      }
      else {
        bVar5 = (byte)(3 << (bVar5 & 0x1f));
        *piVar8 = iVar9;
        lVar12 = 4;
      }
      piVar8 = (int *)((long)piVar8 + lVar12);
      bVar11 = bVar11 | bVar5;
    }
    ints = ints + 1;
    iVar9 = iVar1;
  }
  *pbVar14 = bVar11;
  pbVar14 = pbVar14 + 1;
  numInts = numInts - 4;
  goto LAB_00269a8e;
}

Assistant:

size_t
Usd_IntegerCompression::CompressToBuffer(
    int32_t const *ints, size_t numInts, char *compressed, std::string *err)
{
    return _CompressIntegers(ints, numInts, compressed, err);
}